

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

int lgx_type_cmp_function(lgx_type_function_t *t1,lgx_type_function_t *t2)

{
  uint uVar1;
  lgx_val_type_t lVar2;
  int iVar3;
  long lVar4;
  
  if ((t1->receiver).type == T_UNKNOWN) {
    lVar2 = (t2->receiver).type;
  }
  else {
    lVar2 = lgx_type_cmp(&t1->receiver,&t2->receiver);
  }
  if (lVar2 == T_UNKNOWN) {
    if ((t1->ret).type == T_UNKNOWN) {
      lVar2 = (t2->ret).type;
    }
    else {
      lVar2 = lgx_type_cmp(&t1->ret,&t2->ret);
    }
    if ((lVar2 == T_UNKNOWN) && (uVar1 = t1->arg_len, uVar1 == t2->arg_len)) {
      lVar4 = 0;
      do {
        if ((ulong)uVar1 * 0x20 + 0x20 == lVar4 + 0x20) {
          return 0;
        }
        iVar3 = lgx_type_cmp((lgx_type_t *)((long)&t1->args->type + lVar4),
                             (lgx_type_t *)((long)&t2->args->type + lVar4));
        lVar4 = lVar4 + 0x20;
      } while (iVar3 == 0);
    }
  }
  return 1;
}

Assistant:

int lgx_type_cmp_function(lgx_type_function_t* t1, lgx_type_function_t* t2) {
    if (t1->receiver.type == T_UNKNOWN) {
        if (t2->receiver.type != T_UNKNOWN) {
            return 1;
        }
    } else {
        if (lgx_type_cmp(&t1->receiver, &t2->receiver)) {
            return 1;
        }
    }

    if (t1->ret.type == T_UNKNOWN) {
        if (t2->ret.type != T_UNKNOWN) {
            return 1;
        }
    } else {
        if (lgx_type_cmp(&t1->ret, &t2->ret)) {
            return 1;
        }
    }

    if (t1->arg_len != t2->arg_len) {
        return 1;
    }

    int i;
    for (i = 0; i < t1->arg_len; ++i) {
        if (lgx_type_cmp(&t1->args[i], &t2->args[i])) {
            return 1;
        }
    }

    return 0;
}